

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)19>_> *
vkt::BindingModel::anon_unknown_1::ImageSampleRenderInstance::createDescriptorSetLayout
          (Move<vk::Handle<(vk::HandleType)19>_> *__return_storage_ptr__,DeviceInterface *vki,
          VkDevice device,VkDescriptorType descriptorType,ShaderInputInterface shaderInterface,
          VkShaderStageFlags stageFlags,ImageSampleInstanceImages *images,
          DescriptorUpdateMethod updateMethod)

{
  bool bVar1;
  bool bVar2;
  pointer *local_120;
  VkSampler *local_110;
  pointer *local_100;
  VkSampler *local_f0;
  pointer *local_e0;
  pointer *local_d0;
  VkDescriptorSetLayoutCreateFlags local_98;
  VkDescriptorSetLayoutCreateFlags extraFlags;
  bool addSeparateImage;
  DescriptorSetLayoutBuilder builder;
  VkSampler samplers [2];
  VkShaderStageFlags stageFlags_local;
  ShaderInputInterface shaderInterface_local;
  VkDescriptorType descriptorType_local;
  VkDevice device_local;
  DeviceInterface *vki_local;
  
  builder.m_immutableSamplers.
  super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)ImageSampleInstanceImages::getSamplerA(images);
  samplers[0] = ImageSampleInstanceImages::getSamplerB(images);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&extraFlags);
  bVar2 = descriptorType == VK_DESCRIPTOR_TYPE_SAMPLER;
  local_98 = 0;
  if ((updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH_TEMPLATE) ||
     (updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH)) {
    local_98 = 1;
  }
  switch(shaderInterface) {
  case SHADER_INPUT_SINGLE_DESCRIPTOR:
    if (bVar2) {
      ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                ((DescriptorSetLayoutBuilder *)&extraFlags,VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE,
                 stageFlags);
    }
    bVar2 = ImageSampleInstanceImages::isImmutable(images);
    if (bVar2) {
      local_d0 = &builder.m_immutableSamplers.
                  super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      local_d0 = (pointer *)0x0;
    }
    ::vk::DescriptorSetLayoutBuilder::addSingleSamplerBinding
              ((DescriptorSetLayoutBuilder *)&extraFlags,descriptorType,stageFlags,
               (VkSampler *)local_d0);
    break;
  case SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS:
    if (bVar2) {
      ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                ((DescriptorSetLayoutBuilder *)&extraFlags,VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE,
                 stageFlags);
    }
    bVar2 = ImageSampleInstanceImages::isImmutable(images);
    if (bVar2) {
      local_e0 = &builder.m_immutableSamplers.
                  super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      local_e0 = (pointer *)0x0;
    }
    ::vk::DescriptorSetLayoutBuilder::addSingleSamplerBinding
              ((DescriptorSetLayoutBuilder *)&extraFlags,descriptorType,stageFlags,
               (VkSampler *)local_e0);
    bVar2 = ImageSampleInstanceImages::isImmutable(images);
    if (bVar2) {
      local_f0 = samplers;
    }
    else {
      local_f0 = (VkSampler *)0x0;
    }
    ::vk::DescriptorSetLayoutBuilder::addSingleSamplerBinding
              ((DescriptorSetLayoutBuilder *)&extraFlags,descriptorType,stageFlags,local_f0);
    break;
  case SHADER_INPUT_MULTIPLE_DISCONTIGUOUS_DESCRIPTORS:
    bVar1 = ImageSampleInstanceImages::isImmutable(images);
    if (bVar1) {
      local_100 = &builder.m_immutableSamplers.
                   super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      local_100 = (pointer *)0x0;
    }
    ::vk::DescriptorSetLayoutBuilder::addSingleSamplerBinding
              ((DescriptorSetLayoutBuilder *)&extraFlags,descriptorType,stageFlags,
               (VkSampler *)local_100);
    if (bVar2) {
      ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                ((DescriptorSetLayoutBuilder *)&extraFlags,VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE,
                 stageFlags);
    }
    bVar2 = ImageSampleInstanceImages::isImmutable(images);
    if (bVar2) {
      local_110 = samplers;
    }
    else {
      local_110 = (VkSampler *)0x0;
    }
    ::vk::DescriptorSetLayoutBuilder::addSingleSamplerBinding
              ((DescriptorSetLayoutBuilder *)&extraFlags,descriptorType,stageFlags,local_110);
    break;
  case SHADER_INPUT_DESCRIPTOR_ARRAY:
    if (bVar2) {
      ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                ((DescriptorSetLayoutBuilder *)&extraFlags,VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE,
                 stageFlags);
    }
    bVar2 = ImageSampleInstanceImages::isImmutable(images);
    if (bVar2) {
      local_120 = &builder.m_immutableSamplers.
                   super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      local_120 = (pointer *)0x0;
    }
    ::vk::DescriptorSetLayoutBuilder::addArraySamplerBinding
              ((DescriptorSetLayoutBuilder *)&extraFlags,descriptorType,2,stageFlags,
               (VkSampler *)local_120);
  }
  ::vk::DescriptorSetLayoutBuilder::build
            (__return_storage_ptr__,(DescriptorSetLayoutBuilder *)&extraFlags,vki,device,local_98);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&extraFlags);
  return __return_storage_ptr__;
}

Assistant:

vk::Move<vk::VkDescriptorSetLayout> ImageSampleRenderInstance::createDescriptorSetLayout (const vk::DeviceInterface&		vki,
																						  vk::VkDevice						device,
																						  vk::VkDescriptorType				descriptorType,
																						  ShaderInputInterface				shaderInterface,
																						  vk::VkShaderStageFlags			stageFlags,
																						  const ImageSampleInstanceImages&	images,
																						  DescriptorUpdateMethod			updateMethod)
{
	const vk::VkSampler						samplers[2] =
	{
		images.getSamplerA(),
		images.getSamplerB(),
	};

	vk::DescriptorSetLayoutBuilder			builder;
	const bool								addSeparateImage	= descriptorType == vk::VK_DESCRIPTOR_TYPE_SAMPLER;
	vk::VkDescriptorSetLayoutCreateFlags	extraFlags			= 0;

	if (updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH_TEMPLATE ||
			updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH)
	{
		extraFlags |= vk::VK_DESCRIPTOR_SET_LAYOUT_CREATE_PUSH_DESCRIPTOR_BIT_KHR;
	}

	// (combined)samplers follow
	switch (shaderInterface)
	{
		case SHADER_INPUT_SINGLE_DESCRIPTOR:
			if (addSeparateImage)
				builder.addSingleBinding(vk::VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE, stageFlags);
			builder.addSingleSamplerBinding(descriptorType, stageFlags, (images.isImmutable()) ? (&samplers[0]) : (DE_NULL));
			break;

		case SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS:
			if (addSeparateImage)
				builder.addSingleBinding(vk::VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE, stageFlags);
			builder.addSingleSamplerBinding(descriptorType, stageFlags, (images.isImmutable()) ? (&samplers[0]) : (DE_NULL));
			builder.addSingleSamplerBinding(descriptorType, stageFlags, (images.isImmutable()) ? (&samplers[1]) : (DE_NULL));
			break;

		case SHADER_INPUT_MULTIPLE_DISCONTIGUOUS_DESCRIPTORS:
			builder.addSingleSamplerBinding(descriptorType, stageFlags, (images.isImmutable()) ? (&samplers[0]) : (DE_NULL));
			if (addSeparateImage)
				builder.addSingleBinding(vk::VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE, stageFlags);
			builder.addSingleSamplerBinding(descriptorType, stageFlags, (images.isImmutable()) ? (&samplers[1]) : (DE_NULL));
			break;

		case SHADER_INPUT_DESCRIPTOR_ARRAY:
			if (addSeparateImage)
				builder.addSingleBinding(vk::VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE, stageFlags);
			builder.addArraySamplerBinding(descriptorType, 2u, stageFlags, (images.isImmutable()) ? (samplers) : (DE_NULL));
			break;

		default:
			DE_FATAL("Impossible");
	}

	return builder.build(vki, device, extraFlags);
}